

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::write_data(Stream *strm,char *d,size_t l)

{
  long lVar1;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  ssize_t length;
  size_t offset;
  ulong local_28;
  
  local_28 = 0;
  while( true ) {
    if (in_RDX <= local_28) {
      return true;
    }
    lVar1 = (**(code **)(*in_RDI + 0x28))(in_RDI,in_RSI + local_28,in_RDX - local_28);
    if (lVar1 < 0) break;
    local_28 = lVar1 + local_28;
  }
  return false;
}

Assistant:

inline bool write_data(Stream &strm, const char *d, size_t l) {
  size_t offset = 0;
  while (offset < l) {
    auto length = strm.write(d + offset, l - offset);
    if (length < 0) { return false; }
    offset += static_cast<size_t>(length);
  }
  return true;
}